

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O0

UResourceDataEntry * entryOpenDirect(char *path,char *localeID,UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  size_t sVar3;
  char local_d8 [8];
  char name [157];
  UResourceDataEntry *t1;
  UResourceDataEntry *r;
  UErrorCode *status_local;
  char *localeID_local;
  char *path_local;
  
  initCache(status);
  UVar1 = U_FAILURE(*status);
  if (UVar1 == '\0') {
    umtx_lock_63(&resbMutex);
    t1 = init_entry(localeID,path,status);
    UVar1 = U_SUCCESS(*status);
    if (UVar1 == '\0') {
      t1 = (UResourceDataEntry *)0x0;
    }
    else if (t1->fBogus != U_ZERO_ERROR) {
      t1->fCountExisting = t1->fCountExisting - 1;
      t1 = (UResourceDataEntry *)0x0;
    }
    stack0xffffffffffffffc8 = t1;
    if ((((t1 != (UResourceDataEntry *)0x0) && (iVar2 = strcmp(localeID,"root"), iVar2 != 0)) &&
        (t1->fParent == (UResourceDataEntry *)0x0)) &&
       (((t1->fData).noFallback == '\0' && (sVar3 = strlen(localeID), sVar3 < 0x9d)))) {
      strcpy(local_d8,localeID);
      UVar1 = chopLocale(local_d8);
      if ((((UVar1 == '\0') ||
           ((iVar2 = strcmp(local_d8,"root"), iVar2 == 0 ||
            (UVar1 = loadParentsExceptRoot
                               ((UResourceDataEntry **)(name + 0x98),local_d8,0x9d,'\0',(char *)0x0,
                                status), UVar1 != '\0')))) &&
          (iVar2 = strcmp(stack0xffffffffffffffc8->fName,"root"), iVar2 != 0)) &&
         (stack0xffffffffffffffc8->fParent == (UResourceDataEntry *)0x0)) {
        insertRootBundle((UResourceDataEntry **)(name + 0x98),status);
      }
      UVar1 = U_FAILURE(*status);
      if (UVar1 != '\0') {
        t1 = (UResourceDataEntry *)0x0;
      }
    }
    if (t1 != (UResourceDataEntry *)0x0) {
      for (; stack0xffffffffffffffc8->fParent != (UResourceDataEntry *)0x0;
          unique0x00012000 = stack0xffffffffffffffc8->fParent) {
        stack0xffffffffffffffc8->fParent->fCountExisting =
             stack0xffffffffffffffc8->fParent->fCountExisting + 1;
      }
    }
    umtx_unlock_63(&resbMutex);
    path_local = (char *)t1;
  }
  else {
    path_local = (char *)0x0;
  }
  return (UResourceDataEntry *)path_local;
}

Assistant:

static UResourceDataEntry *
entryOpenDirect(const char* path, const char* localeID, UErrorCode* status) {
    initCache(status);
    if(U_FAILURE(*status)) {
        return NULL;
    }

    umtx_lock(&resbMutex);
    // findFirstExisting() without fallbacks.
    UResourceDataEntry *r = init_entry(localeID, path, status);
    if(U_SUCCESS(*status)) {
        if(r->fBogus != U_ZERO_ERROR) {
            r->fCountExisting--;
            r = NULL;
        }
    } else {
        r = NULL;
    }

    // Some code depends on the ures_openDirect() bundle to have a parent bundle chain,
    // unless it is marked with "nofallback".
    UResourceDataEntry *t1 = r;
    if(r != NULL && uprv_strcmp(localeID, kRootLocaleName) != 0 &&  // not root
            r->fParent == NULL && !r->fData.noFallback &&
            uprv_strlen(localeID) < ULOC_FULLNAME_CAPACITY) {
        char name[ULOC_FULLNAME_CAPACITY];
        uprv_strcpy(name, localeID);
        if(!chopLocale(name) || uprv_strcmp(name, kRootLocaleName) == 0 ||
                loadParentsExceptRoot(t1, name, UPRV_LENGTHOF(name), FALSE, NULL, status)) {
            if(uprv_strcmp(t1->fName, kRootLocaleName) != 0 && t1->fParent == NULL) {
                insertRootBundle(t1, status);
            }
        }
        if(U_FAILURE(*status)) {
            r = NULL;
        }
    }

    if(r != NULL) {
        // TODO: Does this ever loop?
        while(t1->fParent != NULL) {
            t1->fParent->fCountExisting++;
            t1 = t1->fParent;
        }
    }
    umtx_unlock(&resbMutex);
    return r;
}